

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O2

int cf_gcm_decrypt(cf_prp *prp,void *prpctx,uint8_t *cipher,size_t ncipher,uint8_t *header,
                  size_t nheader,uint8_t *nonce,size_t nnonce,uint8_t *tag,size_t ntag,
                  uint8_t *plain)

{
  size_t sVar1;
  byte bVar2;
  undefined8 local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  uint8_t full_tag [16];
  uint8_t H [16];
  uint8_t e_Y0 [16];
  cf_ctr ctr;
  ghash_ctx gh;
  
  H[0] = '\0';
  H[1] = '\0';
  H[2] = '\0';
  H[3] = '\0';
  H[4] = '\0';
  H[5] = '\0';
  H[6] = '\0';
  H[7] = '\0';
  H[8] = '\0';
  H[9] = '\0';
  H[10] = '\0';
  H[0xb] = '\0';
  H[0xc] = '\0';
  H[0xd] = '\0';
  H[0xe] = '\0';
  H[0xf] = '\0';
  (*prp->encrypt)(prpctx,H,H);
  if (nnonce == 0xc) {
    local_138 = *(undefined8 *)nonce;
    _uStack_130 = CONCAT44(0x1000000,*(undefined4 *)(nonce + 8));
  }
  else {
    ghash_init(&gh,H);
    ghash_add_cipher(&gh,nonce,nnonce);
    ghash_final(&gh,(uint8_t *)&local_138);
  }
  ghash_init(&gh,H);
  ghash_add_aad(&gh,header,nheader);
  e_Y0[0] = '\0';
  e_Y0[1] = '\0';
  e_Y0[2] = '\0';
  e_Y0[3] = '\0';
  e_Y0[4] = '\0';
  e_Y0[5] = '\0';
  e_Y0[6] = '\0';
  e_Y0[7] = '\0';
  e_Y0[8] = '\0';
  e_Y0[9] = '\0';
  e_Y0[10] = '\0';
  e_Y0[0xb] = '\0';
  e_Y0[0xc] = '\0';
  e_Y0[0xd] = '\0';
  e_Y0[0xe] = '\0';
  e_Y0[0xf] = '\0';
  cf_ctr_init(&ctr,prp,prpctx,(uint8_t *)&local_138);
  cf_ctr_custom_counter(&ctr,0xc,4);
  cf_ctr_cipher(&ctr,e_Y0,e_Y0,0x10);
  ghash_add_cipher(&gh,cipher,ncipher);
  ghash_final(&gh,full_tag);
  if (0xe < ntag - 2) {
    abort();
  }
  xor_bb(full_tag,full_tag,e_Y0,ntag);
  bVar2 = 0;
  for (sVar1 = 0; ntag != sVar1; sVar1 = sVar1 + 1) {
    bVar2 = bVar2 | full_tag[sVar1] ^ tag[sVar1];
  }
  if (bVar2 == 0) {
    cf_ctr_cipher(&ctr,cipher,plain,ncipher);
  }
  return (uint)(bVar2 != 0);
}

Assistant:

int cf_gcm_decrypt(const cf_prp *prp, void *prpctx,
                   const uint8_t *cipher, size_t ncipher,
                   const uint8_t *header, size_t nheader,
                   const uint8_t *nonce, size_t nnonce,
                   const uint8_t *tag, size_t ntag,
                   uint8_t *plain)
{
  uint8_t H[16] = { 0 };
  uint8_t Y0[16]; 

  /* H = E_K(0^128) */
  prp->encrypt(prpctx, H, H);

  /* Produce CTR nonce, Y_0:
   *
   * if len(IV) == 96
   *   Y_0 = IV || 0^31 || 1
   * otherwise
   *   Y_0 = GHASH(H, {}, IV)
   */

  if (nnonce == 12)
  {
    memcpy(Y0, nonce, nnonce);
    Y0[12] = Y0[13] = Y0[14] = 0x00;
    Y0[15] = 0x01;
  } else {
    ghash_ctx gh;
    ghash_init(&gh, H);
    ghash_add_cipher(&gh, nonce, nnonce);
    ghash_final(&gh, Y0);
  }
  
  /* Hash AAD. */
  ghash_ctx gh;
  ghash_init(&gh, H);
  ghash_add_aad(&gh, header, nheader);

  /* Start counter mode, to obtain offset on tag. */
  uint8_t e_Y0[16] = { 0 };
  cf_ctr ctr;
  cf_ctr_init(&ctr, prp, prpctx, Y0);
  cf_ctr_custom_counter(&ctr, 12, 4);
  cf_ctr_cipher(&ctr, e_Y0, e_Y0, sizeof e_Y0);

  /* Hash ciphertext. */
  ghash_add_cipher(&gh, cipher, ncipher);

  /* Produce tag. */
  uint8_t full_tag[16];
  ghash_final(&gh, full_tag);
  assert(ntag > 1 && ntag <= 16);
  xor_bb(full_tag, full_tag, e_Y0, ntag);

  int err = 1;
  if (!mem_eq(full_tag, tag, ntag))
    goto x_err;
  
  /* Complete decryption. */
  cf_ctr_cipher(&ctr, cipher, plain, ncipher);
  err = 0;
 
x_err:
  mem_clean(H, sizeof H);
  mem_clean(Y0, sizeof Y0);
  mem_clean(e_Y0, sizeof e_Y0);
  mem_clean(full_tag, sizeof full_tag);
  mem_clean(&gh, sizeof gh);
  mem_clean(&ctr, sizeof ctr);
  return err;
}